

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

Datatype * __thiscall
TypeOpIntLess::getInputCast(TypeOpIntLess *this,PcodeOp *op,int4 slot,CastStrategy *castStrategy)

{
  uint uVar1;
  int iVar2;
  Varnode *this_00;
  HighVariable *this_01;
  Datatype *pDVar3;
  undefined4 extraout_var;
  Datatype *curtype;
  Datatype *reqtype;
  CastStrategy *castStrategy_local;
  int4 slot_local;
  PcodeOp *op_local;
  TypeOpIntLess *this_local;
  
  this_local = (TypeOpIntLess *)PcodeOp::inputTypeLocal(op,slot);
  uVar1 = (*castStrategy->_vptr_CastStrategy[4])(castStrategy,op,(ulong)(uint)slot);
  if ((uVar1 & 1) == 0) {
    this_00 = PcodeOp::getIn(op,slot);
    this_01 = Varnode::getHigh(this_00);
    pDVar3 = HighVariable::getType(this_01);
    iVar2 = (*castStrategy->_vptr_CastStrategy[6])(castStrategy,this_local,pDVar3,1,0);
    this_local = (TypeOpIntLess *)CONCAT44(extraout_var,iVar2);
  }
  return (Datatype *)this_local;
}

Assistant:

Datatype *TypeOpIntLess::getInputCast(const PcodeOp *op,int4 slot,const CastStrategy *castStrategy) const

{
  Datatype *reqtype = op->inputTypeLocal(slot);
  if (castStrategy->checkIntPromotionForCompare(op,slot))
    return reqtype;
  Datatype *curtype = op->getIn(slot)->getHigh()->getType();
  return castStrategy->castStandard(reqtype,curtype,true,false);
}